

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void Am_Standard_Widget_Stop_Method_proc(Am_Object *widget,Am_Value *final_value)

{
  Am_Input_Char stop_char;
  bool bVar1;
  Am_Object inter;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  bVar1 = Am_Value::Valid(final_value);
  if (bVar1) {
    Am_Object::Set(widget,0x169,final_value,0);
  }
  Am_Object::Get_Object(&local_18,(Am_Slot_Key)widget,0x1ac);
  Am_Object::Am_Object(&local_20,&local_18);
  Am_Object::Am_Object(&local_28,&Am_No_Object);
  stop_char = Am_Default_Stop_Char;
  Am_Object::Am_Object(&local_30,&Am_No_Object);
  Am_Stop_Interactor(&local_20,&local_28,stop_char,&local_30,0,0,true);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Explicit_Widget_Run_Method, void,
                 Am_Standard_Widget_Stop_Method,
                 (Am_Object widget, Am_Value final_value))
{
  if (final_value.Valid())
    widget.Set(Am_VALUE, final_value);
  Am_Object inter = widget.Get_Object(Am_INTERACTOR);
  Am_Stop_Interactor(inter);
}